

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O0

string * __thiscall
cmNinjaTargetGenerator::GetObjectFileDir
          (string *__return_storage_ptr__,cmNinjaTargetGenerator *this,string *config)

{
  ulong uVar1;
  cmGlobalNinjaGenerator *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  undefined1 local_21;
  string *local_20;
  string *config_local;
  cmNinjaTargetGenerator *this_local;
  string *path;
  
  local_21 = 0;
  local_20 = config;
  config_local = (string *)this;
  this_local = (cmNinjaTargetGenerator *)__return_storage_ptr__;
  cmLocalNinjaGenerator::GetHomeRelativeOutputPath_abi_cxx11_
            (__return_storage_ptr__,this->LocalGenerator);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'/');
  }
  (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
    super_cmOutputConverter._vptr_cmOutputConverter[0x10])
            (&local_78,this->LocalGenerator,(this->super_cmCommonTargetGenerator).GeneratorTarget);
  pcVar2 = GetGlobalGenerator(this);
  (*(pcVar2->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x4d])
            (&local_98,pcVar2,local_20);
  cmStrCat<std::__cxx11::string,std::__cxx11::string>(&local_58,&local_78,&local_98);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  return __return_storage_ptr__;
}

Assistant:

std::string cmNinjaTargetGenerator::GetObjectFileDir(
  const std::string& config) const
{
  std::string path = this->LocalGenerator->GetHomeRelativeOutputPath();
  if (!path.empty()) {
    path += '/';
  }
  path +=
    cmStrCat(this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget),
             this->GetGlobalGenerator()->ConfigDirectory(config));
  return path;
}